

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

int32_t __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsI32(X3DImporter *this,int pAttrIdx)

{
  FIReader *pFVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  char *pcVar5;
  runtime_error *this_00;
  char cVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  int32_t iVar7;
  bool bVar8;
  undefined1 *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  undefined1 local_38 [16];
  char *pcVar4;
  
  pFVar1 = (this->mReader)._M_t.
           super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
           super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x12])
            (&local_48,pFVar1,pAttrIdx);
  if (local_48 == (undefined1 *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(local_48,&FIValue::typeinfo,&FIIntValue::typeinfo,0);
  }
  if (lVar3 == 0) {
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar3 = 0;
  }
  else {
    this_01 = local_40;
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_40->_M_use_count = local_40->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_40->_M_use_count = local_40->_M_use_count + 1;
      }
    }
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (lVar3 == 0) {
    iVar2 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
    pcVar4 = (char *)CONCAT44(extraout_var,iVar2);
    bVar8 = (*pcVar4 - 0x2bU & 0xfd) == 0;
    cVar6 = pcVar4[bVar8];
    iVar2 = 0;
    if (0xf5 < (byte)(cVar6 - 0x3aU)) {
      pcVar5 = pcVar4 + bVar8;
      iVar2 = 0;
      do {
        pcVar5 = pcVar5 + 1;
        iVar2 = (uint)(byte)(cVar6 - 0x30) + iVar2 * 10;
        cVar6 = *pcVar5;
      } while (0xf5 < (byte)(cVar6 - 0x3aU));
    }
    iVar7 = -iVar2;
    if (*pcVar4 != '-') {
      iVar7 = iVar2;
    }
  }
  else {
    if (*(long *)(lVar3 + 0x10) - (long)*(int32_t **)(lVar3 + 8) != 4) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_48 = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Invalid int value","");
      std::runtime_error::runtime_error(this_00,(string *)&local_48);
      *(undefined ***)this_00 = &PTR__runtime_error_00896c98;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar7 = **(int32_t **)(lVar3 + 8);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return iVar7;
}

Assistant:

int32_t X3DImporter::XML_ReadNode_GetAttrVal_AsI32(const int pAttrIdx)
{
    auto intValue = std::dynamic_pointer_cast<const FIIntValue>(mReader->getAttributeEncodedValue(pAttrIdx));
    if (intValue) {
        if (intValue->value.size() == 1) {
            return intValue->value.front();
        }
        throw DeadlyImportError("Invalid int value");
    }
    else {
        return strtol10(mReader->getAttributeValue(pAttrIdx));
    }
}